

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O3

void QJsonPrivate::Writer::objectToJson
               (QCborContainerPrivate *o,QByteArray *json,int indent,bool compact)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (json->d).size;
  if (o == (QCborContainerPrivate *)0x0) {
    lVar5 = 0x10;
  }
  else {
    lVar5 = (long)(int)(o->elements).d.size;
  }
  lVar5 = lVar5 + lVar2;
  pDVar3 = (json->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (lVar4 = (pDVar3->super_QArrayData).alloc,
     (long)((((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar4) -
           (long)(json->d).ptr) < lVar5)) {
    if (lVar5 < lVar2) {
      lVar5 = lVar2;
    }
    QByteArray::reallocData(json,lVar5,KeepSize);
    pDVar3 = (json->d).d;
    if (pDVar3 == (Data *)0x0) goto LAB_002f879e;
    lVar4 = (pDVar3->super_QArrayData).alloc;
  }
  if (lVar4 != 0) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
LAB_002f879e:
  pcVar6 = "{\n";
  if (compact) {
    pcVar6 = "{";
  }
  QByteArray::append(json,pcVar6,-1);
  objectContentToJson(o,json,(uint)!compact + indent,compact);
  QByteArray::QByteArray(&local_40,(long)(indent << 2),' ');
  QByteArray::append(json,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
    }
  }
  pcVar6 = "}\n";
  if (compact) {
    pcVar6 = "}";
  }
  QByteArray::append(json,pcVar6,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Writer::objectToJson(const QCborContainerPrivate *o, QByteArray &json, int indent, bool compact)
{
    json.reserve(json.size() + (o ? (int)o->elements.size() : 16));
    json += compact ? "{" : "{\n";
    objectContentToJson(o, json, indent + (compact ? 0 : 1), compact);
    json += QByteArray(4*indent, ' ');
    json += compact ? "}" : "}\n";
}